

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O3

Value ** __thiscall
ValueHashTable<ExprHash,_Value_*>::FindOrInsertNew
          (ValueHashTable<ExprHash,_Value_*> *this,ExprHash value)

{
  bool bVar1;
  Type *pTVar2;
  uint depth;
  undefined1 local_48 [8];
  EditingIterator iter;
  
  local_48 = (undefined1  [8])(this->table + (ulong)(uint)value % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list =
       (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_48;
  bVar1 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
          EditingIterator::Next((EditingIterator *)local_48);
  depth = 1;
  if (bVar1) {
    do {
      pTVar2 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
               ::Data((Iterator *)local_48);
      if ((uint)pTVar2->value <= (uint)value) {
        if (pTVar2->value == value) {
          return &pTVar2->element;
        }
        break;
      }
      depth = depth + 1;
      bVar1 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_48);
    } while (bVar1);
  }
  pTVar2 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
           EditingIterator::InsertNodeBefore
                     ((EditingIterator *)local_48,&this->alloc->super_ArenaAllocator);
  pTVar2->value = value;
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,depth);
  }
  return &pTVar2->element;
}

Assistant:

TElement * FindOrInsertNew(TData value)
    {
        uint key = Key::Get(value);
        uint hash = this->Hash(key);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, &this->table[hash], iter)
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        HashBucket * newBucket = iter.InsertNodeBefore(this->alloc);
        newBucket->value = value;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return &newBucket->element;
    }